

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O2

uint32_t * pack7_16(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 - base;
  uVar2 = (in[1] - base) * 0x80 | uVar1 - base;
  *out = uVar2;
  uVar2 = (in[2] - base) * 0x4000 | uVar2;
  *out = uVar2;
  uVar2 = (in[3] - base) * 0x200000 | uVar2;
  *out = uVar2;
  *out = (in[4] - base) * 0x10000000 | uVar2;
  uVar2 = in[4] - base >> 4;
  out[1] = uVar2;
  uVar2 = (in[5] - base) * 8 | uVar2;
  out[1] = uVar2;
  uVar2 = (in[6] - base) * 0x400 | uVar2;
  out[1] = uVar2;
  uVar2 = (in[7] - base) * 0x20000 | uVar2;
  out[1] = uVar2;
  uVar2 = (in[8] - base) * 0x1000000 | uVar2;
  out[1] = uVar2;
  out[1] = (in[9] - base) * -0x80000000 | uVar2;
  uVar2 = in[9] - base >> 1;
  out[2] = uVar2;
  uVar2 = (in[10] - base) * 0x40 | uVar2;
  out[2] = uVar2;
  uVar2 = (in[0xb] - base) * 0x2000 | uVar2;
  out[2] = uVar2;
  uVar2 = (in[0xc] - base) * 0x100000 | uVar2;
  out[2] = uVar2;
  out[2] = (in[0xd] - base) * 0x8000000 | uVar2;
  uVar2 = in[0xd] - base >> 5;
  out[3] = uVar2;
  uVar2 = (in[0xe] - base) * 4 | uVar2;
  out[3] = uVar2;
  out[3] = (in[0xf] - base) * 0x200 | uVar2;
  return out + 4;
}

Assistant:

uint32_t * pack7_16( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  7 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  14 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  21 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  28 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 7  -  3 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  3 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  10 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  17 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  24 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  31 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 7  -  6 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  6 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  13 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  20 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  27 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 7  -  2 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  2 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  9 ;
    ++in;

    return out + 1;
}